

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

void __thiscall rw::Image::unpalettize(Image *this,bool forceAlpha)

{
  uint uVar1;
  uint uVar2;
  uint8 *puVar3;
  uint8 *puVar4;
  int iVar5;
  uint8 *puVar6;
  void *__ptr;
  long lVar7;
  uint8 *puVar8;
  int iVar9;
  
  if (this->depth < 9) {
    uVar2 = 1;
    if (!forceAlpha) {
      uVar2 = hasAlpha(this);
    }
    uVar1 = (uVar2 & 0xff) * 8 + 0x18;
    iVar9 = (int)(this->width * uVar1) >> 3;
    allocLocation =
         "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/image.cpp line: 714"
    ;
    __ptr = (void *)0x30018;
    puVar3 = (uint8 *)(*DAT_00149da8)((long)this->height * (long)iVar9);
    if (0 < this->height) {
      puVar4 = this->pixels;
      iVar5 = 0;
      puVar6 = puVar3;
      do {
        if (0 < this->width) {
          lVar7 = 0;
          puVar8 = puVar6;
          do {
            *puVar8 = this->palette[(ulong)puVar4[lVar7] * 4];
            puVar8[1] = this->palette[(ulong)puVar4[lVar7] * 4 + 1];
            puVar8[2] = this->palette[(ulong)puVar4[lVar7] * 4 + 2];
            if ((char)uVar2 == '\0') {
              puVar8 = puVar8 + 3;
            }
            else {
              puVar8[3] = this->palette[(ulong)puVar4[lVar7] * 4 + 3];
              puVar8 = puVar8 + 4;
            }
            lVar7 = lVar7 + 1;
          } while ((int)lVar7 < this->width);
        }
        __ptr = (void *)(long)this->stride;
        puVar4 = puVar4 + (long)__ptr;
        puVar6 = puVar6 + iVar9;
        iVar5 = iVar5 + 1;
      } while (iVar5 < this->height);
    }
    free(this,__ptr);
    this->depth = uVar1;
    this->bpp = uVar1 >> 3;
    this->stride = iVar9;
    this->pixels = puVar3;
    *(byte *)&this->flags = (byte)this->flags | 1;
  }
  return;
}

Assistant:

void
Image::unpalettize(bool forceAlpha)
{
	if(this->depth > 8)
		return;
	assert(this->pixels);
	assert(this->palette);

	int32 ndepth = (forceAlpha || this->hasAlpha()) ? 32 : 24;
	int32 nstride = this->width*ndepth/8;
	uint8 *npixels = rwNewT(uint8, nstride*this->height, MEMDUR_EVENT | ID_IMAGE);

	uint8 *line = this->pixels;
	uint8 *nline = npixels;
	uint8 *p, *np;
	for(int32 y = 0; y < this->height; y++){
		p = line;
		np = nline;
		for(int32 x = 0; x < this->width; x++){
			np[0] = this->palette[*p*4+0];
			np[1] = this->palette[*p*4+1];
			np[2] = this->palette[*p*4+2];
			np += 3;
			if(ndepth == 32)
				*np++ = this->palette[*p*4+3];
			p++;
		}
		line += this->stride;
		nline += nstride;
	}
	this->free();
	this->depth = ndepth;
	this->bpp = ndepth < 8 ? 1 : ndepth/8;
	this->stride = nstride;
	this->setPixels(npixels);
}